

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum-dtoa.cc
# Opt level: O2

void TestBignumDtoaShortestVariousFloats(void)

{
  int requested_digits;
  int *piVar2;
  int *length_00;
  Vector<char> buffer;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  Vector<char> buffer_03;
  Vector<char> buffer_04;
  Vector<char> buffer_05;
  Vector<char> buffer_06;
  Vector<char> buffer_07;
  Vector<char> buffer_08;
  int *in_stack_ffffffffffffff58;
  int point;
  int length;
  char buffer_container [100];
  int *piVar1;
  int *value_source;
  
  value_source = &length;
  length_00 = &point;
  buffer._8_8_ = value_source;
  buffer.start_ = (char *)0x64;
  requested_digits = (int)buffer_container;
  piVar1 = value_source;
  piVar2 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x1,1.401298464324817e-45,BIGNUM_DTOA_SHORTEST,requested_digits,
             buffer,length_00,in_stack_ffffffffffffff58);
  CheckEqualsHelper((char *)0x10e,0xc080e4,"1",buffer_container,(char *)piVar1,(char *)piVar2);
  CheckEqualsHelper((char *)0x10f,0xc0d1e8,(char *)0xffffffffffffffd4,point,(char *)piVar1,
                    (int)piVar2);
  buffer_00._8_8_ = value_source;
  buffer_00.start_ = (char *)0x64;
  piVar1 = value_source;
  piVar2 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x1,3.4028234663852886e+38,BIGNUM_DTOA_SHORTEST,requested_digits,
             buffer_00,length_00,in_stack_ffffffffffffff58);
  CheckEqualsHelper((char *)0x115,0xc0d1ec,"34028235",buffer_container,(char *)piVar1,(char *)piVar2
                   );
  CheckEqualsHelper((char *)0x116,0xc1dd0f,(char *)0x27,point,(char *)piVar1,(int)piVar2);
  buffer_01._8_8_ = value_source;
  buffer_01.start_ = (char *)0x64;
  piVar1 = value_source;
  piVar2 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x1,4294967296.0,BIGNUM_DTOA_SHORTEST,requested_digits,buffer_01,
             length_00,in_stack_ffffffffffffff58);
  CheckEqualsHelper((char *)0x11a,0xc0d200,"42949673",buffer_container,(char *)piVar1,(char *)piVar2
                   );
  CheckEqualsHelper((char *)0x11b,0xc0df44,(char *)0xa,point,(char *)piVar1,(int)piVar2);
  buffer_02._8_8_ = value_source;
  buffer_02.start_ = (char *)0x64;
  piVar1 = value_source;
  piVar2 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x1,3.32306998946229e+35,BIGNUM_DTOA_SHORTEST,requested_digits,
             buffer_02,length_00,in_stack_ffffffffffffff58);
  CheckEqualsHelper((char *)0x11f,0xc0d214,"332307",buffer_container,(char *)piVar1,(char *)piVar2);
  CheckEqualsHelper((char *)0x120,0x955419,(char *)0x24,point,(char *)piVar1,(int)piVar2);
  buffer_03._8_8_ = value_source;
  buffer_03.start_ = (char *)0x64;
  piVar1 = value_source;
  piVar2 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x1,1.2341235575308664e-41,BIGNUM_DTOA_SHORTEST,requested_digits,
             buffer_03,length_00,in_stack_ffffffffffffff58);
  CheckEqualsHelper((char *)0x124,0xc0d224,"12341",buffer_container,(char *)piVar1,(char *)piVar2);
  CheckEqualsHelper((char *)0x125,0xc0d22c,(char *)0xffffffffffffffd8,point,(char *)piVar1,
                    (int)piVar2);
  buffer_04._8_8_ = value_source;
  buffer_04.start_ = (char *)0x64;
  piVar1 = value_source;
  piVar2 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x1,33554432.0,BIGNUM_DTOA_SHORTEST,requested_digits,buffer_04,
             length_00,in_stack_ffffffffffffff58);
  CheckEqualsHelper((char *)0x129,0xc0d230,"33554432",buffer_container,(char *)piVar1,(char *)piVar2
                   );
  CheckEqualsHelper((char *)0x12a,0xc12bb5,(char *)0x8,point,(char *)piVar1,(int)piVar2);
  buffer_05._8_8_ = value_source;
  buffer_05.start_ = (char *)0x64;
  piVar1 = value_source;
  piVar2 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x1,326494756798464.0,BIGNUM_DTOA_SHORTEST,requested_digits,
             buffer_05,length_00,in_stack_ffffffffffffff58);
  CheckEqualsHelper((char *)0x12e,0xc0d244,"32649476",buffer_container,(char *)piVar1,(char *)piVar2
                   );
  CheckEqualsHelper((char *)0x12f,0xc1aa69,(char *)0xf,point,(char *)piVar1,(int)piVar2);
  buffer_06._8_8_ = value_source;
  buffer_06.start_ = (char *)0x64;
  piVar1 = value_source;
  piVar2 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x1,3.9113222363777194e+37,BIGNUM_DTOA_SHORTEST,requested_digits,
             buffer_06,length_00,in_stack_ffffffffffffff58);
  CheckEqualsHelper((char *)0x133,0xc0d24f,"39113222",buffer_container,(char *)piVar1,(char *)piVar2
                   );
  CheckEqualsHelper((char *)0x134,0xa52039,(char *)0x26,point,(char *)piVar1,(int)piVar2);
  buffer_07._8_8_ = value_source;
  buffer_07.start_ = (char *)0x64;
  piVar1 = value_source;
  piVar2 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x1,1.1754943508222875e-38,BIGNUM_DTOA_SHORTEST,requested_digits,
             buffer_07,length_00,in_stack_ffffffffffffff58);
  CheckEqualsHelper((char *)0x139,0xc0d263,"11754944",buffer_container,(char *)piVar1,(char *)piVar2
                   );
  CheckEqualsHelper((char *)0x13a,0xc0d277,(char *)0xffffffdb,point,(char *)piVar1,(int)piVar2);
  buffer_08._8_8_ = value_source;
  buffer_08.start_ = (char *)0x64;
  double_conversion::BignumDtoa
            ((double_conversion *)0x1,1.1754942106924411e-38,BIGNUM_DTOA_SHORTEST,requested_digits,
             buffer_08,length_00,in_stack_ffffffffffffff58);
  CheckEqualsHelper((char *)0x13f,0xc0d27b,"11754942",buffer_container,(char *)value_source,
                    (char *)length_00);
  CheckEqualsHelper((char *)0x140,0xc0d277,(char *)0xffffffdb,point,(char *)value_source,
                    (int)length_00);
  return;
}

Assistant:

TEST(BignumDtoaShortestVariousFloats) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  int length;
  int point;

  float min_float = 1e-45f;
  BignumDtoa(min_float, BIGNUM_DTOA_SHORTEST_SINGLE, 0,
             buffer, &length, &point);
  CHECK_EQ("1", buffer.start());
  CHECK_EQ(-44, point);


  float max_float = 3.4028234e38f;
  BignumDtoa(max_float, BIGNUM_DTOA_SHORTEST_SINGLE, 0,
             buffer, &length, &point);
  CHECK_EQ("34028235", buffer.start());
  CHECK_EQ(39, point);

  BignumDtoa(4294967272.0f, BIGNUM_DTOA_SHORTEST_SINGLE, 0,
             buffer, &length, &point);
  CHECK_EQ("42949673", buffer.start());
  CHECK_EQ(10, point);

  BignumDtoa(3.32306998946228968226e+35f, BIGNUM_DTOA_SHORTEST_SINGLE, 0,
             buffer, &length, &point);
  CHECK_EQ("332307", buffer.start());
  CHECK_EQ(36, point);

  BignumDtoa(1.2341e-41f, BIGNUM_DTOA_SHORTEST_SINGLE, 0,
             buffer, &length, &point);
  CHECK_EQ("12341", buffer.start());
  CHECK_EQ(-40, point);

  BignumDtoa(3.3554432e7, BIGNUM_DTOA_SHORTEST_SINGLE, 0,
             buffer, &length, &point);
  CHECK_EQ("33554432", buffer.start());
  CHECK_EQ(8, point);

  BignumDtoa(3.26494756798464e14f, BIGNUM_DTOA_SHORTEST_SINGLE, 0,
             buffer, &length, &point);
  CHECK_EQ("32649476", buffer.start());
  CHECK_EQ(15, point);

  BignumDtoa(3.91132223637771935344e37f, BIGNUM_DTOA_SHORTEST_SINGLE, 0,
             buffer, &length, &point);
  CHECK_EQ("39113222", buffer.start());
  CHECK_EQ(38, point);

  uint32_t smallest_normal32 = 0x00800000;
  double v = Single(smallest_normal32).value();
  BignumDtoa(v, BIGNUM_DTOA_SHORTEST_SINGLE, 0, buffer, &length, &point);
  CHECK_EQ("11754944", buffer.start());
  CHECK_EQ(-37, point);

  uint32_t largest_denormal32 = 0x007FFFFF;
  v = Single(largest_denormal32).value();
  BignumDtoa(v, BIGNUM_DTOA_SHORTEST_SINGLE, 0, buffer, &length, &point);
  CHECK_EQ("11754942", buffer.start());
  CHECK_EQ(-37, point);
}